

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O2

void TransactionalAppendToPK(DuckDB *db,idx_t thread_idx)

{
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var1;
  _Alloc_hider _Var2;
  char cVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  pointer pQVar7;
  pointer pDVar8;
  long lVar9;
  initializer_list<duckdb::Value> __l;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> local_120;
  string local_118;
  ReusableStringStream local_f8;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> chunk;
  AssertionHandler catchAssertionHandler;
  StringRef local_88;
  ulong local_78;
  ulong local_70;
  Connection con;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_48;
  
  local_120._M_head_impl = (QueryResult *)0x0;
  duckdb::Connection::Connection(&con,db);
  std::__cxx11::string::string
            ((string *)&catchAssertionHandler,"BEGIN TRANSACTION",(allocator *)&local_f8);
  duckdb::Connection::Query((string *)&local_118);
  _Var2._M_p = local_118._M_dataplus._M_p;
  _Var1._M_head_impl = local_120._M_head_impl;
  local_118._M_dataplus._M_p = (pointer)0x0;
  local_120._M_head_impl = (QueryResult *)_Var2._M_p;
  if (_Var1._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)_Var1._M_head_impl + 8))();
    if ((long *)local_118._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_118._M_dataplus._M_p + 8))();
    }
  }
  local_118._M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::~string((string *)&catchAssertionHandler);
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             &local_120);
  cVar3 = duckdb::BaseQueryResult::HasError();
  if (cVar3 != '\0') {
    local_118._M_dataplus._M_p = "FAIL";
    local_118._M_string_length = 4;
    local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x471750;
    local_f8.m_index = 0x113;
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_118,(SourceLineInfo *)&local_f8,
               (StringRef)ZEXT816(0x484131),Normal);
    local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
    local_f8.m_index = 0;
    local_f8.m_oss = (ostream *)0x0;
    Catch::ReusableStringStream::ReusableStringStream(&local_f8);
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               &local_120);
    psVar6 = (string *)duckdb::BaseQueryResult::GetError_abi_cxx11_();
    std::operator<<(local_f8.m_oss,psVar6);
    Catch::ReusableStringStream::str_abi_cxx11_(&local_118,&local_f8);
    local_88.m_start = local_118._M_dataplus._M_p;
    local_88.m_size = local_118._M_string_length;
    Catch::AssertionHandler::handleMessage(&catchAssertionHandler,ExplicitFailure,&local_88);
    std::__cxx11::string::~string((string *)&local_118);
    Catch::ReusableStringStream::~ReusableStringStream(&local_f8);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  std::__cxx11::string::string
            ((string *)&catchAssertionHandler,"SELECT COUNT(*) FROM integers WHERE i >= 0",
             (allocator *)&local_f8);
  duckdb::Connection::Query((string *)&local_118);
  _Var2._M_p = local_118._M_dataplus._M_p;
  _Var1._M_head_impl = local_120._M_head_impl;
  local_118._M_dataplus._M_p = (pointer)0x0;
  local_120._M_head_impl = (QueryResult *)_Var2._M_p;
  if (_Var1._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)_Var1._M_head_impl + 8))();
    if ((long *)local_118._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_118._M_dataplus._M_p + 8))();
    }
  }
  local_118._M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::~string((string *)&catchAssertionHandler);
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             &local_120);
  cVar3 = duckdb::BaseQueryResult::HasError();
  if (cVar3 != '\0') {
    local_118._M_dataplus._M_p = "FAIL";
    local_118._M_string_length = 4;
    local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x471750;
    local_f8.m_index = 0x119;
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_118,(SourceLineInfo *)&local_f8,
               (StringRef)ZEXT816(0x484131),Normal);
    local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
    local_f8.m_index = 0;
    local_f8.m_oss = (ostream *)0x0;
    Catch::ReusableStringStream::ReusableStringStream(&local_f8);
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               &local_120);
    psVar6 = (string *)duckdb::BaseQueryResult::GetError_abi_cxx11_();
    std::operator<<(local_f8.m_oss,psVar6);
    Catch::ReusableStringStream::str_abi_cxx11_(&local_118,&local_f8);
    local_88.m_start = local_118._M_dataplus._M_p;
    local_88.m_size = local_118._M_string_length;
    Catch::AssertionHandler::handleMessage(&catchAssertionHandler,ExplicitFailure,&local_88);
    std::__cxx11::string::~string((string *)&local_118);
    Catch::ReusableStringStream::~ReusableStringStream(&local_f8);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  pQVar7 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)&local_120);
  (**(code **)(*(long *)pQVar7 + 0x10))(&chunk,pQVar7);
  pDVar8 = duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
           operator->(&chunk);
  duckdb::DataChunk::GetValue((ulong)&catchAssertionHandler,(ulong)pDVar8);
  iVar5 = duckdb::Value::GetValue<int>();
  duckdb::Value::~Value((Value *)&catchAssertionHandler);
  local_78 = (ulong)(iVar5 + 1);
  local_70 = (ulong)(uint)((int)thread_idx * 1000);
  for (lVar9 = 0; lVar9 != 0x32; lVar9 = lVar9 + 1) {
    std::__cxx11::string::string
              ((string *)&catchAssertionHandler,"INSERT INTO integers VALUES ($1)",
               (allocator *)&local_f8);
    iVar5 = (int)&catchAssertionHandler;
    duckdb::Connection::Query<int>((Connection *)&local_118,(string *)&con,iVar5);
    _Var2._M_p = local_118._M_dataplus._M_p;
    _Var1._M_head_impl = local_120._M_head_impl;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_120._M_head_impl = (QueryResult *)_Var2._M_p;
    if (_Var1._M_head_impl != (QueryResult *)0x0) {
      (**(code **)(*(long *)_Var1._M_head_impl + 8))();
      if ((long *)local_118._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_118._M_dataplus._M_p + 8))();
      }
    }
    local_118._M_dataplus._M_p = (pointer)0x0;
    std::__cxx11::string::~string((string *)&catchAssertionHandler);
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               &local_120);
    cVar3 = duckdb::BaseQueryResult::HasError();
    if (cVar3 != '\0') {
      local_118._M_dataplus._M_p = "FAIL";
      local_118._M_string_length = 4;
      local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x471750;
      local_f8.m_index = 0x123;
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_118,(SourceLineInfo *)&local_f8,
                 (StringRef)ZEXT816(0x484131),Normal);
      local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      local_f8.m_index = 0;
      local_f8.m_oss = (ostream *)0x0;
      Catch::ReusableStringStream::ReusableStringStream(&local_f8);
      duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
      operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
                 &local_120);
      psVar6 = (string *)duckdb::BaseQueryResult::GetError_abi_cxx11_();
      std::operator<<(local_f8.m_oss,psVar6);
      Catch::ReusableStringStream::str_abi_cxx11_(&local_118,&local_f8);
      local_88.m_start = local_118._M_dataplus._M_p;
      local_88.m_size = local_118._M_string_length;
      Catch::AssertionHandler::handleMessage(&catchAssertionHandler,ExplicitFailure,&local_88);
      std::__cxx11::string::~string((string *)&local_118);
      Catch::ReusableStringStream::~ReusableStringStream(&local_f8);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    std::__cxx11::string::string
              ((string *)&catchAssertionHandler,
               "SELECT COUNT(*), COUNT(DISTINCT i) FROM integers WHERE i >= 0",
               (allocator *)&local_f8);
    duckdb::Connection::Query((string *)&local_118);
    _Var2._M_p = local_118._M_dataplus._M_p;
    _Var1._M_head_impl = local_120._M_head_impl;
    local_118._M_dataplus._M_p = (pointer)0x0;
    local_120._M_head_impl = (QueryResult *)_Var2._M_p;
    if (_Var1._M_head_impl != (QueryResult *)0x0) {
      (**(code **)(*(long *)_Var1._M_head_impl + 8))();
      if ((long *)local_118._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_118._M_dataplus._M_p + 8))();
      }
    }
    local_118._M_dataplus._M_p = (pointer)0x0;
    std::__cxx11::string::~string((string *)&catchAssertionHandler);
    duckdb::Value::INTEGER(iVar5);
    __l._M_len = 1;
    __l._M_array = (iterator)&catchAssertionHandler;
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              (&local_48,__l,(allocator_type *)&local_118);
    bVar4 = duckdb::CHECK_COLUMN
                      ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                        *)&local_120,0,(vector<duckdb::Value,_true> *)&local_48);
    std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_48);
    duckdb::Value::~Value((Value *)&catchAssertionHandler);
    if (!bVar4) {
      local_118._M_dataplus._M_p = "FAIL";
      local_118._M_string_length = 4;
      local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x471750;
      local_f8.m_index = 0x129;
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_118,(SourceLineInfo *)&local_f8,
                 (StringRef)ZEXT816(0x484131),Normal);
      local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      local_f8.m_index = 0;
      local_f8.m_oss = (ostream *)0x0;
      Catch::ReusableStringStream::ReusableStringStream(&local_f8);
      std::operator<<(local_f8.m_oss,"Incorrect result in TransactionalAppendToPK");
      Catch::ReusableStringStream::str_abi_cxx11_(&local_118,&local_f8);
      local_88.m_start = local_118._M_dataplus._M_p;
      local_88.m_size = local_118._M_string_length;
      Catch::AssertionHandler::handleMessage(&catchAssertionHandler,ExplicitFailure,&local_88);
      std::__cxx11::string::~string((string *)&local_118);
      Catch::ReusableStringStream::~ReusableStringStream(&local_f8);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
  }
  std::__cxx11::string::string((string *)&catchAssertionHandler,"COMMIT",(allocator *)&local_f8);
  duckdb::Connection::Query((string *)&local_118);
  _Var2._M_p = local_118._M_dataplus._M_p;
  _Var1._M_head_impl = local_120._M_head_impl;
  local_118._M_dataplus._M_p = (pointer)0x0;
  local_120._M_head_impl = (QueryResult *)_Var2._M_p;
  if (_Var1._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)_Var1._M_head_impl + 8))();
    if ((long *)local_118._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_118._M_dataplus._M_p + 8))();
    }
  }
  local_118._M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::~string((string *)&catchAssertionHandler);
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             &local_120);
  cVar3 = duckdb::BaseQueryResult::HasError();
  if (cVar3 != '\0') {
    local_118._M_dataplus._M_p = "FAIL";
    local_118._M_string_length = 4;
    local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x471750;
    local_f8.m_index = 0x12f;
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_118,(SourceLineInfo *)&local_f8,
               (StringRef)ZEXT816(0x484131),Normal);
    local_f8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
    local_f8.m_index = 0;
    local_f8.m_oss = (ostream *)0x0;
    Catch::ReusableStringStream::ReusableStringStream(&local_f8);
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               &local_120);
    psVar6 = (string *)duckdb::BaseQueryResult::GetError_abi_cxx11_();
    std::operator<<(local_f8.m_oss,psVar6);
    Catch::ReusableStringStream::str_abi_cxx11_(&local_118,&local_f8);
    local_88.m_start = local_118._M_dataplus._M_p;
    local_88.m_size = local_118._M_string_length;
    Catch::AssertionHandler::handleMessage(&catchAssertionHandler,ExplicitFailure,&local_88);
    std::__cxx11::string::~string((string *)&local_118);
    Catch::ReusableStringStream::~ReusableStringStream(&local_f8);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
            (&chunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>);
  duckdb::Connection::~Connection(&con);
  if (local_120._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)local_120._M_head_impl + 8))();
  }
  return;
}

Assistant:

static void TransactionalAppendToPK(DuckDB *db, idx_t thread_idx) {
	duckdb::unique_ptr<QueryResult> result;

	Connection con(*db);
	result = con.Query("BEGIN TRANSACTION");
	if (result->HasError()) {
		FAIL(result->GetError());
	}

	// get the initial count
	result = con.Query("SELECT COUNT(*) FROM integers WHERE i >= 0");
	if (result->HasError()) {
		FAIL(result->GetError());
	}

	auto chunk = result->Fetch();
	auto initial_count = chunk->GetValue(0, 0).GetValue<int32_t>();

	for (idx_t i = 0; i < 50; i++) {

		result = con.Query("INSERT INTO integers VALUES ($1)", (int32_t)(thread_idx * 1000 + i));
		if (result->HasError()) {
			FAIL(result->GetError());
		}

		// check the count
		result = con.Query("SELECT COUNT(*), COUNT(DISTINCT i) FROM integers WHERE i >= 0");
		if (!CHECK_COLUMN(result, 0, {Value::INTEGER(initial_count + i + 1)})) {
			FAIL("Incorrect result in TransactionalAppendToPK");
		}
	}

	result = con.Query("COMMIT");
	if (result->HasError()) {
		FAIL(result->GetError());
	}
}